

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O2

bool __thiscall DAGPropagator::propagate(DAGPropagator *this)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  reference rVar5;
  allocator_type local_5a;
  bool local_59;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  bVar4 = false;
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.es.sz,&local_59,
             &local_5a);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&this->processed_e,(vector<bool,_std::allocator<bool>_> *)&local_58);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(int)(this->super_DReachabilityPropagator).super_GraphPropagator.vs.sz,&local_59,
             &local_5a);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&this->processed_n,(vector<bool,_std::allocator<bool>_> *)&local_58);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  bVar1 = DReachabilityPropagator::propagate(&this->super_DReachabilityPropagator);
  if (bVar1) {
    for (p_Var3 = (this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_DReachabilityPropagator).new_edge._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->processed_e,(long)(int)p_Var3[1]._M_color);
      if (((*rVar5._M_p & rVar5._M_mask) == 0) &&
         (iVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x11])(this,(ulong)p_Var3[1]._M_color), (char)iVar2 == '\0')) {
        return false;
      }
    }
    for (p_Var3 = (this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        bVar4 = (_Rb_tree_header *)p_Var3 ==
                &(this->super_DReachabilityPropagator).new_node._M_t._M_impl.super__Rb_tree_header,
        !bVar4; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->processed_n,(long)(int)p_Var3[1]._M_color);
      if (((*rVar5._M_p & rVar5._M_mask) == 0) &&
         (iVar2 = (*(this->super_DReachabilityPropagator).super_GraphPropagator.super_Propagator.
                    _vptr_Propagator[0x14])(this,(ulong)p_Var3[1]._M_color), (char)iVar2 == '\0')) {
        return bVar4;
      }
    }
  }
  return bVar4;
}

Assistant:

bool DAGPropagator::propagate() {
	processed_e = std::vector<bool>(nbEdges(), false);
	processed_n = std::vector<bool>(nbNodes(), false);

	if (!DReachabilityPropagator::propagate()) {
		return false;
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!processed_e[*it]) {
			if (!propagateNewEdge(*it)) {
				return false;
			}
		}
	}

	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!processed_n[*it]) {
			if (!propagateNewNode(*it)) {
				return false;
			}
		}
	}

	return true;
}